

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CovarianceMatrix.cpp
# Opt level: O2

void __thiscall CovarianceMatrix::~CovarianceMatrix(CovarianceMatrix *this)

{
  ~CovarianceMatrix(this);
  operator_delete(this);
  return;
}

Assistant:

CovarianceMatrix::~CovarianceMatrix()
{
    delete[] _queryRootIndex;
}